

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t zeInit(ze_init_flags_t flags)

{
  anon_class_4_1_a7e9dda7 local_10;
  ze_init_flags_t local_c;
  ze_init_flags_t flags_local;
  
  local_10.flags = flags;
  local_c = flags;
  std::call_once<zeInit::__0>(ze_lib::context,&local_10);
  if ((ze_lib::destruction & 1) != 0) {
    zeInit::result = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zeInit::result;
}

Assistant:

ze_result_t ZE_APICALL
zeInit(
    ze_init_flags_t flags                           ///< [in] initialization flags.
                                                    ///< must be 0 (default) or a combination of ::ze_init_flag_t.
    )
{
    static ze_result_t result = ZE_RESULT_SUCCESS;
    #ifdef DYNAMIC_LOAD_LOADER
    if (!ze_lib::context) {
        ze_lib::context = new ze_lib::context_t;
    }
    #endif
    std::call_once(ze_lib::context->initOnce, [flags]() {
        result = ze_lib::context->Init(flags, false, nullptr);

        if( ZE_RESULT_SUCCESS != result )
            return result;

        if(ze_lib::destruction) {
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }

        auto pfnInit = ze_lib::context->zeDdiTable.load()->Global.pfnInit;
        if( nullptr == pfnInit ) {
            if(!ze_lib::context->isInitialized)
                return ZE_RESULT_ERROR_UNINITIALIZED;
            else
                return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }

        result = pfnInit( flags );
        return result;
    });

    if(ze_lib::destruction) {
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    }

    return result;
}